

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O3

int run_test_we_get_signals(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  long lVar5;
  uint uVar6;
  uv_handle_t *puVar7;
  timer_ctx *ptVar8;
  int64_t eval_b;
  int64_t eval_a;
  signal_ctx sc [4];
  timer_ctx tc [2];
  undefined1 auStack_790 [144];
  undefined1 auStack_700 [136];
  undefined1 auStack_678 [136];
  undefined1 auStack_5f0 [136];
  signal_ctx sStack_568;
  uv_loop_t *puStack_4d8;
  void *pvStack_488;
  undefined1 auStack_480 [144];
  signal_ctx sStack_3f0;
  uv_loop_t *puStack_368;
  timer_ctx *ptStack_360;
  ulong local_358;
  ulong local_350;
  signal_ctx local_348;
  signal_ctx sStack_2c0;
  signal_ctx local_238;
  signal_ctx local_1b0;
  timer_ctx local_128;
  timer_ctx tStack_a0;
  
  ptStack_360 = (timer_ctx *)0x1b9d03;
  puVar4 = uv_default_loop();
  ptStack_360 = (timer_ctx *)0x1b9d1d;
  start_watcher(puVar4,10,&local_348,0);
  ptStack_360 = (timer_ctx *)0x1b9d38;
  start_watcher(puVar4,10,&sStack_2c0,0);
  ptStack_360 = (timer_ctx *)0x1b9d4f;
  start_watcher(puVar4,0xc,&local_238,0);
  ptStack_360 = (timer_ctx *)0x1b9d66;
  start_watcher(puVar4,0xc,&local_1b0,0);
  ptStack_360 = (timer_ctx *)0x1b9d7e;
  start_timer(puVar4,10,&local_128);
  ptStack_360 = (timer_ctx *)0x1b9d91;
  start_timer(puVar4,0xc,&tStack_a0);
  ptStack_360 = (timer_ctx *)0x1b9d9b;
  iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
  local_350 = (ulong)iVar3;
  local_358 = 0;
  if (local_350 != 0) goto LAB_001b9e80;
  lVar5 = 4;
  do {
    local_350 = (ulong)*(uint *)((long)&local_348.stop_or_close + lVar5);
    local_358 = 10;
    if (local_350 != 10) {
      ptStack_360 = (timer_ctx *)0x1b9e73;
      run_test_we_get_signals_cold_2();
      goto LAB_001b9e73;
    }
    lVar5 = lVar5 + 0x88;
  } while (lVar5 != 0x224);
  ptVar8 = &local_128;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    local_350 = (ulong)ptVar8->ncalls;
    local_358 = 10;
    if (local_350 != 10) goto LAB_001b9e73;
    ptVar8 = &tStack_a0;
    bVar1 = false;
  } while (bVar2);
  ptStack_360 = (timer_ctx *)0x1b9e26;
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  ptStack_360 = (timer_ctx *)0x1b9e30;
  uv_run(puVar4,UV_RUN_DEFAULT);
  local_350 = 0;
  ptStack_360 = (timer_ctx *)0x1b9e41;
  iVar3 = uv_loop_close(puVar4);
  local_358 = (ulong)iVar3;
  if (local_350 == local_358) {
    ptStack_360 = (timer_ctx *)0x1b9e57;
    uv_library_shutdown();
    return 0;
  }
  goto LAB_001b9e8d;
LAB_001b9e73:
  ptStack_360 = (timer_ctx *)0x1b9e80;
  run_test_we_get_signals_cold_3();
LAB_001b9e80:
  ptStack_360 = (timer_ctx *)0x1b9e8d;
  run_test_we_get_signals_cold_1();
LAB_001b9e8d:
  ptStack_360 = (timer_ctx *)run_test_we_get_signal_one_shot;
  run_test_we_get_signals_cold_4();
  puStack_368 = puVar4;
  ptStack_360 = &tStack_a0;
  puVar4 = uv_default_loop();
  start_timer(puVar4,0x11,(timer_ctx *)(auStack_480 + 8));
  start_watcher(puVar4,0x11,&sStack_3f0,1);
  sStack_3f0.stop_or_close = NOOP;
  iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
  auStack_480._0_8_ = SEXT48(iVar3);
  pvStack_488 = (void *)0x0;
  if ((void *)auStack_480._0_8_ == (void *)0x0) {
    auStack_480._0_8_ = ZEXT48((uint)auStack_480._8_4_);
    pvStack_488 = (void *)0xa;
    if ((void *)auStack_480._0_8_ != (void *)0xa) goto LAB_001ba0b7;
    auStack_480._0_8_ = (void *)0x1;
    pvStack_488 = (void *)(ulong)sStack_3f0.ncalls;
    if (pvStack_488 != (void *)0x1) goto LAB_001ba0c6;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_480 + 8));
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_480._0_8_ = SEXT48(iVar3);
    pvStack_488 = (void *)0x0;
    if ((void *)auStack_480._0_8_ != (void *)0x0) goto LAB_001ba0d5;
    auStack_480._0_8_ = (void *)0x1;
    pvStack_488 = (void *)(ulong)sStack_3f0.ncalls;
    if (pvStack_488 != (void *)0x1) goto LAB_001ba0e4;
    sStack_3f0.stop_or_close = CLOSE;
    sStack_3f0.ncalls = 0;
    uv_signal_start_oneshot(&sStack_3f0.handle,signal_cb_one_shot,0x11);
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_480 + 8));
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_480._0_8_ = SEXT48(iVar3);
    pvStack_488 = (void *)0x0;
    if ((void *)auStack_480._0_8_ != (void *)0x0) goto LAB_001ba0f3;
    auStack_480._0_8_ = ZEXT48((uint)auStack_480._8_4_);
    pvStack_488 = (void *)0xa;
    if ((void *)auStack_480._0_8_ != (void *)0xa) goto LAB_001ba102;
    auStack_480._0_8_ = (void *)0x1;
    pvStack_488 = (void *)(ulong)sStack_3f0.ncalls;
    if (pvStack_488 != (void *)0x1) goto LAB_001ba111;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_480._0_8_ = (void *)0x0;
    iVar3 = uv_loop_close(puVar4);
    pvStack_488 = (void *)(long)iVar3;
    if ((void *)auStack_480._0_8_ == pvStack_488) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_001ba0b7:
    run_test_we_get_signal_one_shot_cold_2();
LAB_001ba0c6:
    run_test_we_get_signal_one_shot_cold_3();
LAB_001ba0d5:
    run_test_we_get_signal_one_shot_cold_4();
LAB_001ba0e4:
    run_test_we_get_signal_one_shot_cold_5();
LAB_001ba0f3:
    run_test_we_get_signal_one_shot_cold_6();
LAB_001ba102:
    run_test_we_get_signal_one_shot_cold_7();
LAB_001ba111:
    run_test_we_get_signal_one_shot_cold_8();
  }
  puVar7 = (uv_handle_t *)auStack_480;
  uVar6 = (uint)&pvStack_488;
  run_test_we_get_signal_one_shot_cold_9();
  if (uVar6 == puVar7[1].flags) {
    iVar3 = *(int *)&puVar7[-1].field_0x3c + 1;
    *(int *)&puVar7[-1].field_0x3c = iVar3;
    if (iVar3 == 1) {
      if (puVar7[-1].flags == 0) {
        uv_close(puVar7,(uv_close_cb)0x0);
        return extraout_EAX;
      }
      return 1;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_4d8 = puVar4;
  puVar4 = uv_default_loop();
  start_timer(puVar4,0x11,(timer_ctx *)(auStack_790 + 8));
  start_watcher(puVar4,0x11,(signal_ctx *)auStack_700,1);
  start_watcher(puVar4,0x11,(signal_ctx *)auStack_678,1);
  auStack_700._0_4_ = CLOSE;
  auStack_678._0_4_ = CLOSE;
  iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
  auStack_790._0_8_ = SEXT48(iVar3);
  if ((void *)auStack_790._0_8_ == (void *)0x0) {
    auStack_790._0_8_ = ZEXT48((uint)auStack_790._8_4_);
    if ((void *)auStack_790._0_8_ != (void *)0xa) goto LAB_001ba84f;
    auStack_790._0_8_ = (void *)0x1;
    if (auStack_700._4_4_ != 1) goto LAB_001ba85e;
    auStack_790._0_8_ = (void *)0x1;
    if (auStack_678._4_4_ != 1) goto LAB_001ba86d;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_790 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_700,1);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_678,1);
    auStack_700._0_4_ = CLOSE;
    auStack_678._0_4_ = CLOSE;
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_5f0,0);
    uv_close((uv_handle_t *)(auStack_5f0 + 8),(uv_close_cb)0x0);
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_790._0_8_ = SEXT48(iVar3);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba87c;
    auStack_790._0_8_ = ZEXT48((uint)auStack_790._8_4_);
    if ((void *)auStack_790._0_8_ != (void *)0xa) goto LAB_001ba88b;
    auStack_790._0_8_ = (void *)0x1;
    if (auStack_700._4_4_ != 1) goto LAB_001ba89a;
    auStack_790._0_8_ = (void *)0x1;
    if (auStack_678._4_4_ != 1) goto LAB_001ba8a9;
    auStack_790._0_8_ = ZEXT48((uint)auStack_5f0._4_4_);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba8b8;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_790 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_700,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_678,0);
    auStack_700._0_4_ = CLOSE;
    auStack_678._0_4_ = CLOSE;
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_5f0,1);
    uv_close((uv_handle_t *)(auStack_5f0 + 8),(uv_close_cb)0x0);
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_790._0_8_ = SEXT48(iVar3);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba8c7;
    auStack_790._0_8_ = ZEXT48((uint)auStack_790._8_4_);
    if ((void *)auStack_790._0_8_ != (void *)0xa) goto LAB_001ba8d6;
    auStack_790._0_8_ = ZEXT48((uint)auStack_700._4_4_);
    if ((void *)auStack_790._0_8_ != (void *)0xa) goto LAB_001ba8e5;
    auStack_790._0_8_ = ZEXT48((uint)auStack_678._4_4_);
    if ((void *)auStack_790._0_8_ != (void *)0xa) goto LAB_001ba8f4;
    auStack_790._0_8_ = ZEXT48((uint)auStack_5f0._4_4_);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba903;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_790 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_700,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_678,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_5f0,1);
    start_watcher(puVar4,0x11,&sStack_568,1);
    auStack_5f0._0_4_ = CLOSE;
    sStack_568.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_700 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_678 + 8),(uv_close_cb)0x0);
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_790._0_8_ = SEXT48(iVar3);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba912;
    auStack_790._0_8_ = ZEXT48((uint)auStack_790._8_4_);
    if ((void *)auStack_790._0_8_ != (void *)0xa) goto LAB_001ba921;
    auStack_790._0_8_ = ZEXT48((uint)auStack_700._4_4_);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba930;
    auStack_790._0_8_ = ZEXT48((uint)auStack_678._4_4_);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba93f;
    auStack_790._0_8_ = (void *)0x1;
    if (auStack_5f0._4_4_ != 1) goto LAB_001ba94e;
    auStack_790._0_8_ = (void *)0x1;
    start_timer(puVar4,0x11,(timer_ctx *)(auStack_790 + 8));
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_700,0);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_678,1);
    start_watcher(puVar4,0x11,(signal_ctx *)auStack_5f0,0);
    start_watcher(puVar4,0x11,&sStack_568,0);
    sStack_568.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_700 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_5f0 + 8),(uv_close_cb)0x0);
    iVar3 = uv_run(puVar4,UV_RUN_DEFAULT);
    auStack_790._0_8_ = SEXT48(iVar3);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba96c;
    auStack_790._0_8_ = ZEXT48((uint)auStack_790._8_4_);
    if ((void *)auStack_790._0_8_ != (void *)0xa) goto LAB_001ba97b;
    auStack_790._0_8_ = ZEXT48((uint)auStack_700._4_4_);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba98a;
    auStack_790._0_8_ = (void *)0x1;
    if (auStack_678._4_4_ != 1) goto LAB_001ba999;
    auStack_790._0_8_ = ZEXT48((uint)auStack_5f0._4_4_);
    if ((void *)auStack_790._0_8_ != (void *)0x0) goto LAB_001ba9a8;
    auStack_790._0_8_ = ZEXT48(sStack_568.ncalls);
    if ((void *)auStack_790._0_8_ == (void *)0xa) {
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      auStack_790._0_8_ = (void *)0x0;
      iVar3 = uv_loop_close(puVar4);
      if ((void *)auStack_790._0_8_ == (void *)(long)iVar3) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ba9c6;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001ba84f:
    run_test_we_get_signals_mixed_cold_2();
LAB_001ba85e:
    run_test_we_get_signals_mixed_cold_3();
LAB_001ba86d:
    run_test_we_get_signals_mixed_cold_4();
LAB_001ba87c:
    run_test_we_get_signals_mixed_cold_5();
LAB_001ba88b:
    run_test_we_get_signals_mixed_cold_6();
LAB_001ba89a:
    run_test_we_get_signals_mixed_cold_7();
LAB_001ba8a9:
    run_test_we_get_signals_mixed_cold_8();
LAB_001ba8b8:
    run_test_we_get_signals_mixed_cold_9();
LAB_001ba8c7:
    run_test_we_get_signals_mixed_cold_10();
LAB_001ba8d6:
    run_test_we_get_signals_mixed_cold_11();
LAB_001ba8e5:
    run_test_we_get_signals_mixed_cold_12();
LAB_001ba8f4:
    run_test_we_get_signals_mixed_cold_13();
LAB_001ba903:
    run_test_we_get_signals_mixed_cold_14();
LAB_001ba912:
    run_test_we_get_signals_mixed_cold_15();
LAB_001ba921:
    run_test_we_get_signals_mixed_cold_16();
LAB_001ba930:
    run_test_we_get_signals_mixed_cold_17();
LAB_001ba93f:
    run_test_we_get_signals_mixed_cold_18();
LAB_001ba94e:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001ba96c:
    run_test_we_get_signals_mixed_cold_21();
LAB_001ba97b:
    run_test_we_get_signals_mixed_cold_22();
LAB_001ba98a:
    run_test_we_get_signals_mixed_cold_23();
LAB_001ba999:
    run_test_we_get_signals_mixed_cold_24();
LAB_001ba9a8:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001ba9c6:
  puVar7 = (uv_handle_t *)auStack_790;
  run_test_we_get_signals_mixed_cold_27();
  iVar3 = uv_is_closing(puVar7);
  if (iVar3 == 0) {
    uv_close(puVar7,(uv_close_cb)0x0);
    return extraout_EAX_00;
  }
  return iVar3;
}

Assistant:

TEST_IMPL(we_get_signals) {
  struct signal_ctx sc[4];
  struct timer_ctx tc[2];
  uv_loop_t* loop;
  unsigned int i;

  loop = uv_default_loop();
  start_watcher(loop, SIGUSR1, sc + 0, 0);
  start_watcher(loop, SIGUSR1, sc + 1, 0);
  start_watcher(loop, SIGUSR2, sc + 2, 0);
  start_watcher(loop, SIGUSR2, sc + 3, 0);
  start_timer(loop, SIGUSR1, tc + 0);
  start_timer(loop, SIGUSR2, tc + 1);
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  for (i = 0; i < ARRAY_SIZE(sc); i++)
    ASSERT_EQ(sc[i].ncalls, NSIGNALS);

  for (i = 0; i < ARRAY_SIZE(tc); i++)
    ASSERT_EQ(tc[i].ncalls, NSIGNALS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}